

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundFunction.cpp
# Opt level: O1

BoundFunction * Js::BoundFunction::New(ScriptContext *scriptContext,ArgumentReader *args)

{
  Recycler *alloc;
  BoundFunction *this;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  local_58 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_5f772cc;
  data.filename._0_4_ = 0x61;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_58);
  this = (BoundFunction *)new<Memory::Recycler>(0x50,alloc,0x38bbb2);
  data._32_8_ = (args->super_Arguments).Info;
  BoundFunction(this,(Arguments *)&data.line,
                (((scriptContext->super_ScriptContextBase).javascriptLibrary)->boundFunctionType).
                ptr);
  return this;
}

Assistant:

BoundFunction* BoundFunction::New(ScriptContext* scriptContext, ArgumentReader args)
    {
        Recycler* recycler = scriptContext->GetRecycler();

        BoundFunction* boundFunc = RecyclerNew(recycler, BoundFunction, args,
            scriptContext->GetLibrary()->GetBoundFunctionType());
        return boundFunc;
    }